

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O2

void __thiscall
ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  FP *pFVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  long lVar3;
  double dVar4;
  AssertHelper local_d8;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  MassType mass;
  ParticleTest_Constructor_Test<pica::Particle<(pica::Dimension)1>_> *local_a0;
  FactorType factor;
  ChargeType charge;
  MomentumType local_88;
  ParticleType particle;
  PositionType position;
  
  position.x = 3.1;
  local_88.x = -231300000000.0;
  local_88.y = 0.0;
  local_88.z = 1.23e-05;
  mass = 9.10938215e-28;
  charge = -4.80320427e-10;
  factor = 140.0;
  pica::Particle<(pica::Dimension)1>::Particle(&particle,&position,&local_88,140.0,0);
  gtest_ar_1._0_8_ = particle.position.x;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"position[d]","particle.getPosition()[d]",&position.x,
             (double *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar_1);
  }
  else {
    local_a0 = this;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
      pica::Particle<(pica::Dimension)1>::getMomentum(&particle);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar_1,"momentum[d]","particle.getMomentum()[d]",
                 (double *)((long)&local_88.x + lVar3),(double *)(&gtest_ar.success_ + lVar3));
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x35,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        this_00 = &gtest_ar_1.message_;
        goto LAB_00190d20;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
    }
    gtest_ar_1._0_8_ = *(undefined8 *)(pica::ParticleTypes::types + (long)particle.typeIndex * 0x10)
    ;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"mass","particle.getMass()",&mass,(double *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x36,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar_1);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar_1._0_8_ =
           *(undefined8 *)(pica::ParticleTypes::types + 8 + (long)particle.typeIndex * 0x10);
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)&gtest_ar,"charge","particle.getCharge()",&charge,(double *)&gtest_ar_1
                );
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_1);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                   ,0x37,pcVar2);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar_1);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        gtest_ar_1._0_8_ = particle.factor;
        testing::internal::CmpHelperEQ<double,double>
                  ((internal *)&gtest_ar,"factor","particle.getFactor()",&factor,
                   (double *)&gtest_ar_1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_1);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                     ,0x38,pcVar2);
          testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar_1);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          dVar4 = SQRT((local_88.z * local_88.z + local_88.x * local_88.x + local_88.y * local_88.y)
                       / (mass * 29979245800.0 * mass * 29979245800.0) + 1.0);
          (local_a0->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
          super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.
          maxRelativeError = 1e-12;
          pFVar1 = &(local_a0->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
                    super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture
                    .maxAbsoluteError;
          if (ABS(dVar4) < *pFVar1 || ABS(dVar4) == *pFVar1) {
            gtest_ar_1._0_8_ = ABS(dVar4 + -1.0 / particle.invGamma);
            testing::internal::CmpHelperLE<double,double>
                      ((internal *)&gtest_ar,"fabs(expectedGamma - particle.getGamma())",
                       "this->maxAbsoluteError",(double *)&gtest_ar_1,
                       &(local_a0->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
                        super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.
                        super_BaseFixture.maxAbsoluteError);
            if (gtest_ar.success_ != false) goto LAB_00190cd6;
            testing::Message::Message((Message *)&gtest_ar_1);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                       ,0x3b,pcVar2);
            testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar_1);
          }
          else {
            gtest_ar_1._0_8_ = ABS((-1.0 / particle.invGamma + dVar4) / dVar4);
            testing::internal::CmpHelperLE<double,double>
                      ((internal *)&gtest_ar,
                       "fabs(expectedGamma - particle.getGamma()) / fabs(expectedGamma)",
                       "this->maxRelativeError",(double *)&gtest_ar_1,
                       &(local_a0->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
                        super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.
                        super_BaseFixture.maxRelativeError);
            if (gtest_ar.success_ != false) {
LAB_00190cd6:
              this_00 = &gtest_ar.message_;
              goto LAB_00190d20;
            }
            testing::Message::Message((Message *)&gtest_ar_1);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                       ,0x3b,pcVar2);
            testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar_1);
          }
        }
      }
    }
  }
  this_00 = &gtest_ar.message_;
  testing::internal::AssertHelper::~AssertHelper(&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1);
LAB_00190d20:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, Constructor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(3.1, -32.1, 4.3e-5);
    MomentumType momentum(-231.3e9, 0.0, 1.23e-5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    FactorType factor = static_cast<FactorType>(1.4e2);

    ParticleType particle(position, momentum, factor, 0);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(factor, particle.getFactor());
    GammaType expectedGamma = sqrt((FP)1 + momentum.norm2() / sqr(mass * Constants<GammaType >::c()));
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}